

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

PixelBufferAccess * __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getAccessInternal
          (PixelBufferAccess *__return_storage_ptr__,LayeredImage *this)

{
  TextureFormat TVar1;
  TextureFormat *pTVar2;
  PixelBufferAccess *extraout_RAX;
  int i;
  long lVar3;
  
  switch(this->m_type) {
  case TEXTURETYPE_2D:
    pTVar2 = (TextureFormat *)
             (((this->m_tex2D).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar2;
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar3] =
           (&pTVar2[1].order)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar3] =
           (&pTVar2[2].type)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    break;
  case TEXTURETYPE_CUBE:
  case TEXTURETYPE_CUBE_ARRAY:
  case TEXTURETYPE_1D:
  case TEXTURETYPE_1D_ARRAY:
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&__return_storage_ptr__->super_ConstPixelBufferAccess);
    return extraout_RAX;
  case TEXTURETYPE_2D_ARRAY:
    pTVar2 = (TextureFormat *)
             (((this->m_tex2DArray).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar2;
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar3] =
           (&pTVar2[1].order)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar3] =
           (&pTVar2[2].type)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    break;
  case TEXTURETYPE_3D:
    pTVar2 = (TextureFormat *)
             (((this->m_tex3D).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar2;
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar3] =
           (&pTVar2[1].order)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar3] =
           (&pTVar2[2].type)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    break;
  case TEXTURETYPE_BUFFER:
    pTVar2 = (TextureFormat *)
             (((this->m_texBuffer).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar2;
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar3] =
           (&pTVar2[1].order)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar3] =
           (&pTVar2[2].type)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    break;
  default:
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format.order = CHANNELORDER_LAST;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format.type = CHANNELTYPE_LAST;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[0] = 0;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[1] = 0;
    *(undefined8 *)((__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data + 2) = 0;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[1] = 0;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[2] = 0;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_data = (void *)0x0;
    return (PixelBufferAccess *)0x2600000015;
  }
  TVar1 = pTVar2[4];
  (__return_storage_ptr__->super_ConstPixelBufferAccess).m_data = (void *)TVar1;
  return (PixelBufferAccess *)TVar1;
}

Assistant:

PixelBufferAccess LayeredImage::getAccessInternal (void) const
{
	DE_ASSERT(m_type == TEXTURETYPE_BUFFER || m_type == TEXTURETYPE_2D || m_type == TEXTURETYPE_3D || m_type == TEXTURETYPE_2D_ARRAY);

	return m_type == TEXTURETYPE_BUFFER		? m_texBuffer->getLevel(0)
		 : m_type == TEXTURETYPE_2D			? m_tex2D->getLevel(0)
		 : m_type == TEXTURETYPE_3D			? m_tex3D->getLevel(0)
		 : m_type == TEXTURETYPE_2D_ARRAY	? m_tex2DArray->getLevel(0)
		 : PixelBufferAccess();
}